

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sha512_256.c
# Opt level: O0

CURLcode Curl_sha512_256it(uchar *output,uchar *input,size_t input_size)

{
  CURLcode CVar1;
  undefined1 local_30 [4];
  CURLcode res;
  Curl_sha512_256_ctx ctx;
  size_t input_size_local;
  uchar *input_local;
  uchar *output_local;
  
  ctx = (Curl_sha512_256_ctx)input_size;
  input_size_local = (size_t)input;
  input_local = output;
  output_local._4_4_ = Curl_sha512_256_init(local_30);
  if (output_local._4_4_ == CURLE_OK) {
    CVar1 = Curl_sha512_256_update(local_30,(uchar *)input_size_local,(size_t)ctx);
    if (CVar1 == CURLE_OK) {
      output_local._4_4_ = Curl_sha512_256_finish(input_local,local_30);
    }
    else {
      Curl_sha512_256_finish(input_local,local_30);
      output_local._4_4_ = CVar1;
    }
  }
  return output_local._4_4_;
}

Assistant:

CURLcode
Curl_sha512_256it(unsigned char *output, const unsigned char *input,
                  size_t input_size)
{
  Curl_sha512_256_ctx ctx;
  CURLcode res;

  res = Curl_sha512_256_init(&ctx);
  if(res != CURLE_OK)
    return res;

  res = Curl_sha512_256_update(&ctx, (const void *) input, input_size);

  if(res != CURLE_OK) {
    (void) Curl_sha512_256_finish(output, &ctx);
    return res;
  }

  return Curl_sha512_256_finish(output, &ctx);
}